

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_write_set_format_ar.c
# Opt level: O2

int archive_write_ar_header(archive_write *a,archive_entry *entry)

{
  char cVar1;
  long *plVar2;
  bool bVar3;
  undefined4 uVar4;
  ulong uVar5;
  int iVar6;
  mode_t mVar7;
  char *pcVar8;
  size_t sVar9;
  time_t v;
  la_int64_t lVar10;
  char *__s;
  char *pcVar11;
  char *pcVar12;
  ulong uVar13;
  long lVar14;
  long lVar15;
  uint uVar16;
  uint uVar17;
  long local_88;
  char buff [60];
  
  plVar2 = (long *)a->format_data;
  *(undefined4 *)(plVar2 + 2) = 0;
  local_88 = archive_entry_size(entry);
  pcVar8 = archive_entry_pathname(entry);
  if ((pcVar8 == (char *)0x0) || (cVar1 = *pcVar8, cVar1 == '\0')) {
LAB_0055465b:
    pcVar8 = "Invalid filename";
    goto LAB_00554662;
  }
  if ((char)plVar2[3] == '\0') {
    __archive_write_output(a,"!<arch>\n",8);
    *(undefined1 *)(plVar2 + 3) = 1;
    cVar1 = *pcVar8;
  }
  builtin_strncpy(buff,"                                                          `\n",0x3c);
  if ((cVar1 == '/') && (pcVar8[1] == '\0')) {
    builtin_strncpy(buff,"/       ",8);
LAB_005546a2:
    bVar3 = false;
    __s = (char *)0x0;
LAB_005546a8:
    v = archive_entry_mtime(entry);
    iVar6 = format_decimal(v,buff + 0x10,0xc);
    if (iVar6 == 0) {
      lVar10 = archive_entry_uid(entry);
      iVar6 = format_decimal(lVar10,buff + 0x1c,6);
      if (iVar6 == 0) {
        lVar10 = archive_entry_gid(entry);
        iVar6 = format_decimal(lVar10,buff + 0x22,6);
        if (iVar6 == 0) {
          mVar7 = archive_entry_mode(entry);
          uVar5 = (ulong)mVar7;
          lVar15 = 0;
          uVar16 = 8;
          do {
            lVar14 = lVar15;
            uVar13 = uVar5;
            buff[lVar14 + 0x2f] = (byte)uVar13 & 7 | 0x30;
            uVar17 = uVar16 - 1;
            lVar15 = lVar14 + -1;
            if (uVar16 < 2) break;
            uVar5 = uVar13 >> 3;
            uVar16 = uVar17;
          } while (7 < uVar13);
          if (uVar13 < 8) {
            memmove(buff + 0x28,buff + lVar14 + 0x2f,-lVar15);
            pcVar8 = buff + 0x28 + -lVar15;
            for (; 0 < (int)uVar17; uVar17 = uVar17 - 1) {
              *pcVar8 = ' ';
              pcVar8 = pcVar8 + 1;
            }
            if (__s == (char *)0x0) {
              __s = (char *)0x0;
            }
            else {
              mVar7 = archive_entry_filetype(entry);
              if (mVar7 != 0x8000) {
                pcVar8 = "Regular file required for non-pseudo member";
                goto LAB_00554662;
              }
            }
            goto LAB_005549ae;
          }
          for (lVar14 = 0; (int)lVar14 != 8; lVar14 = lVar14 + 1) {
            buff[lVar15 + lVar14 + 0x30] = '7';
          }
          pcVar8 = "Numeric mode too large";
        }
        else {
          pcVar8 = "Numeric group ID too large";
        }
      }
      else {
        pcVar8 = "Numeric user ID too large";
      }
    }
    else {
      pcVar8 = "File modification time too large";
    }
  }
  else {
    iVar6 = strcmp(pcVar8,"/SYM64/");
    if (iVar6 == 0) {
      builtin_strncpy(buff,"/SYM64/",7);
      uVar4 = buff._0_4_;
      buff._0_8_ = CONCAT44(buff._4_4_,uVar4);
      goto LAB_005546a2;
    }
    iVar6 = strcmp(pcVar8,"__.SYMDEF");
    if (iVar6 == 0) {
      builtin_strncpy(buff,"__.SYMDE",8);
      buff[8] = 'F';
      goto LAB_005546a2;
    }
    if (((cVar1 == '/') && (pcVar8[1] == '/')) && (pcVar8[2] == '\0')) {
      *(undefined4 *)(plVar2 + 2) = 1;
      buff[0] = '/';
      buff[1] = '/';
      bVar3 = false;
      __s = (char *)0x0;
LAB_005549ae:
      iVar6 = format_decimal(local_88,buff + 0x30,10);
      if (iVar6 == 0) {
        iVar6 = __archive_write_output(a,buff,0x3c);
        if (iVar6 != 0) {
          return iVar6;
        }
        *plVar2 = local_88;
        plVar2[1] = (ulong)((uint)local_88 & 1);
        if (!bVar3) {
          return 0;
        }
        sVar9 = strlen(__s);
        iVar6 = __archive_write_output(a,__s,sVar9);
        if (iVar6 != 0) {
          return iVar6;
        }
        sVar9 = strlen(__s);
        *plVar2 = *plVar2 - sVar9;
        return 0;
      }
      pcVar8 = "File size out of range";
    }
    else {
      sVar9 = strlen(pcVar8);
      if (pcVar8[sVar9 - 1] == '/') goto LAB_0055465b;
      pcVar11 = pcVar8 + sVar9;
      do {
        __s = pcVar11 + -1;
        if (__s <= pcVar8) break;
        pcVar12 = pcVar11 + -2;
        pcVar11 = __s;
      } while (*pcVar12 != '/');
      iVar6 = (a->archive).archive_format;
      if (iVar6 == 0x70001) {
        sVar9 = strlen(__s);
        if (sVar9 < 0x10) {
          memcpy(buff,__s,sVar9);
          buff[sVar9] = '/';
          goto LAB_0055498d;
        }
        if (*(int *)((long)plVar2 + 0x14) < 1) {
          pcVar8 = "Can\'t find string table";
        }
        else {
          pcVar8 = (char *)malloc(sVar9 + 3);
          if (pcVar8 == (char *)0x0) {
            archive_set_error(&a->archive,0xc,"Can\'t allocate filename buffer");
            return -0x1e;
          }
          memcpy(pcVar8,__s,sVar9);
          sVar9 = strlen(__s);
          (pcVar8 + sVar9)[0] = '/';
          (pcVar8 + sVar9)[1] = '\n';
          pcVar8[sVar9 + 2] = '\0';
          pcVar11 = (char *)plVar2[4];
          pcVar12 = strstr(pcVar11,pcVar8);
          free(pcVar8);
          if (pcVar12 != (char *)0x0) {
            buff[0] = '/';
            iVar6 = format_decimal((long)pcVar12 - (long)pcVar11,buff + 1,0xf);
            if (iVar6 != 0) {
              pcVar8 = "string table offset too large";
              goto LAB_005549ca;
            }
            goto LAB_0055498d;
          }
          pcVar8 = "Invalid string table";
        }
LAB_00554662:
        iVar6 = 0x16;
        goto LAB_005549cc;
      }
      if (iVar6 != 0x70002) {
LAB_0055498d:
        bVar3 = false;
        goto LAB_005546a8;
      }
      sVar9 = strlen(__s);
      if ((sVar9 < 0x11) && (pcVar8 = strchr(__s,0x20), pcVar8 == (char *)0x0)) {
        memcpy(buff,__s,sVar9);
        buff[sVar9] = ' ';
        goto LAB_0055498d;
      }
      buff[0] = '\0';
      buff[1] = '\0';
      buff[2] = '/';
      buff[0] = '#';
      buff[1] = '1';
      iVar6 = format_decimal(sVar9,buff + 3,0xd);
      if (iVar6 == 0) {
        sVar9 = strlen(__s);
        local_88 = local_88 + sVar9;
        bVar3 = true;
        goto LAB_005546a8;
      }
      pcVar8 = "File name too long";
    }
  }
LAB_005549ca:
  iVar6 = 0x22;
LAB_005549cc:
  archive_set_error(&a->archive,iVar6,pcVar8);
  return -0x14;
}

Assistant:

static int
archive_write_ar_header(struct archive_write *a, struct archive_entry *entry)
{
	int ret, append_fn;
	char buff[60];
	char *ss, *se;
	struct ar_w *ar;
	const char *pathname;
	const char *filename;
	int64_t size;

	append_fn = 0;
	ar = (struct ar_w *)a->format_data;
	ar->is_strtab = 0;
	filename = NULL;
	size = archive_entry_size(entry);


	/*
	 * Reject files with empty name.
	 */
	pathname = archive_entry_pathname(entry);
	if (pathname == NULL || *pathname == '\0') {
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	/*
	 * If we are now at the beginning of the archive,
	 * we need first write the ar global header.
	 */
	if (!ar->wrote_global_header) {
		__archive_write_output(a, "!<arch>\n", 8);
		ar->wrote_global_header = 1;
	}

	memset(buff, ' ', 60);
	memcpy(&buff[AR_fmag_offset], "`\n", 2);

	if (strcmp(pathname, "/") == 0 ) {
		/* Entry is archive symbol table in GNU format */
		buff[AR_name_offset] = '/';
		goto stat;
	}
	if (strcmp(pathname, "/SYM64/") == 0) {
		/* Entry is archive symbol table in GNU 64-bit format */
		memcpy(buff + AR_name_offset, "/SYM64/", 7);
		goto stat;
	}
	if (strcmp(pathname, "__.SYMDEF") == 0) {
		/* Entry is archive symbol table in BSD format */
		memcpy(buff + AR_name_offset, "__.SYMDEF", 9);
		goto stat;
	}
	if (strcmp(pathname, "//") == 0) {
		/*
		 * Entry is archive filename table, inform that we should
		 * collect strtab in next _data call.
		 */
		ar->is_strtab = 1;
		buff[AR_name_offset] = buff[AR_name_offset + 1] = '/';
		/*
		 * For archive string table, only ar_size field should
		 * be set.
		 */
		goto size;
	}

	/*
	 * Otherwise, entry is a normal archive member.
	 * Strip leading paths from filenames, if any.
	 */
	if ((filename = ar_basename(pathname)) == NULL) {
		/* Reject filenames with trailing "/" */
		archive_set_error(&a->archive, EINVAL,
		    "Invalid filename");
		return (ARCHIVE_WARN);
	}

	if (a->archive.archive_format == ARCHIVE_FORMAT_AR_GNU) {
		/*
		 * SVR4/GNU variant use a "/" to mark then end of the filename,
		 * make it possible to have embedded spaces in the filename.
		 * So, the longest filename here (without extension) is
		 * actually 15 bytes.
		 */
		if (strlen(filename) <= 15) {
			memcpy(&buff[AR_name_offset],
			    filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = '/';
		} else {
			/*
			 * For filename longer than 15 bytes, GNU variant
			 * makes use of a string table and instead stores the
			 * offset of the real filename to in the ar_name field.
			 * The string table should have been written before.
			 */
			if (ar->has_strtab <= 0) {
				archive_set_error(&a->archive, EINVAL,
				    "Can't find string table");
				return (ARCHIVE_WARN);
			}

			se = (char *)malloc(strlen(filename) + 3);
			if (se == NULL) {
				archive_set_error(&a->archive, ENOMEM,
				    "Can't allocate filename buffer");
				return (ARCHIVE_FATAL);
			}

			memcpy(se, filename, strlen(filename));
			strcpy(se + strlen(filename), "/\n");

			ss = strstr(ar->strtab, se);
			free(se);

			if (ss == NULL) {
				archive_set_error(&a->archive, EINVAL,
				    "Invalid string table");
				return (ARCHIVE_WARN);
			}

			/*
			 * GNU variant puts "/" followed by digits into
			 * ar_name field. These digits indicates the real
			 * filename string's offset to the string table.
			 */
			buff[AR_name_offset] = '/';
			if (format_decimal(ss - ar->strtab,
			    buff + AR_name_offset + 1,
			    AR_name_size - 1)) {
				archive_set_error(&a->archive, ERANGE,
				    "string table offset too large");
				return (ARCHIVE_WARN);
			}
		}
	} else if (a->archive.archive_format == ARCHIVE_FORMAT_AR_BSD) {
		/*
		 * BSD variant: for any file name which is more than
		 * 16 chars or contains one or more embedded space(s), the
		 * string "#1/" followed by the ASCII length of the name is
		 * put into the ar_name field. The file size (stored in the
		 * ar_size field) is incremented by the length of the name.
		 * The name is then written immediately following the
		 * archive header.
		 */
		if (strlen(filename) <= 16 && strchr(filename, ' ') == NULL) {
			memcpy(&buff[AR_name_offset], filename, strlen(filename));
			buff[AR_name_offset + strlen(filename)] = ' ';
		}
		else {
			memcpy(buff + AR_name_offset, "#1/", 3);
			if (format_decimal(strlen(filename),
			    buff + AR_name_offset + 3,
			    AR_name_size - 3)) {
				archive_set_error(&a->archive, ERANGE,
				    "File name too long");
				return (ARCHIVE_WARN);
			}
			append_fn = 1;
			size += strlen(filename);
		}
	}

stat:
	if (format_decimal(archive_entry_mtime(entry), buff + AR_date_offset, AR_date_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File modification time too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_uid(entry), buff + AR_uid_offset, AR_uid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric user ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_decimal(archive_entry_gid(entry), buff + AR_gid_offset, AR_gid_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric group ID too large");
		return (ARCHIVE_WARN);
	}
	if (format_octal(archive_entry_mode(entry), buff + AR_mode_offset, AR_mode_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "Numeric mode too large");
		return (ARCHIVE_WARN);
	}
	/*
	 * Sanity Check: A non-pseudo archive member should always be
	 * a regular file.
	 */
	if (filename != NULL && archive_entry_filetype(entry) != AE_IFREG) {
		archive_set_error(&a->archive, EINVAL,
		    "Regular file required for non-pseudo member");
		return (ARCHIVE_WARN);
	}

size:
	if (format_decimal(size, buff + AR_size_offset, AR_size_size)) {
		archive_set_error(&a->archive, ERANGE,
		    "File size out of range");
		return (ARCHIVE_WARN);
	}

	ret = __archive_write_output(a, buff, 60);
	if (ret != ARCHIVE_OK)
		return (ret);

	ar->entry_bytes_remaining = size;
	ar->entry_padding = ar->entry_bytes_remaining % 2;

	if (append_fn > 0) {
		ret = __archive_write_output(a, filename, strlen(filename));
		if (ret != ARCHIVE_OK)
			return (ret);
		ar->entry_bytes_remaining -= strlen(filename);
	}

	return (ARCHIVE_OK);
}